

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.cpp
# Opt level: O0

void __thiscall
VulkanUtilities::VulkanCommandBuffer::TransitionImageLayout
          (VulkanCommandBuffer *this,VkImage Image,VkImageLayout OldLayout,VkImageLayout NewLayout,
          VkImageSubresourceRange *SubresRange,VkPipelineStageFlags SrcStages,
          VkPipelineStageFlags DstStages)

{
  uint Min0;
  uint Min1;
  VkAccessFlags VVar1;
  Char *pCVar2;
  value_type *pvVar3;
  reference pvVar4;
  uint local_138;
  uint local_134;
  uint local_130;
  uint local_12c;
  undefined1 local_108 [8];
  VkImageMemoryBarrier ImgBarrier;
  bool MipsOverlap;
  bool SlicesOverlap;
  uint EndMip1;
  uint32_t StartMip1;
  uint EndMip0;
  uint32_t StartMip0;
  uint EndLayer1;
  uint32_t StartLayer1;
  uint EndLayer0;
  uint32_t StartLayer0;
  VkImageSubresourceRange *OtherRange;
  value_type *ImgBarrier_1;
  size_t i;
  string msg_1;
  undefined1 local_50 [8];
  string msg;
  VkPipelineStageFlags SrcStages_local;
  VkImageSubresourceRange *SubresRange_local;
  VkImageLayout NewLayout_local;
  VkImageLayout OldLayout_local;
  VkImage Image_local;
  VulkanCommandBuffer *this_local;
  
  msg.field_2._12_4_ = SrcStages;
  EndRenderScope(this);
  if ((msg.field_2._12_4_ & (this->m_Barrier).SupportedStagesMask) == 0) {
    Diligent::FormatString<char[26],char[49]>
              ((string *)local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"(SrcStages & m_Barrier.SupportedStagesMask) != 0",(char (*) [49])this
              );
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar2,"TransitionImageLayout",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanCommandBuffer.cpp"
               ,0xa2);
    std::__cxx11::string::~string((string *)local_50);
  }
  if ((DstStages & (this->m_Barrier).SupportedStagesMask) == 0) {
    Diligent::FormatString<char[26],char[49]>
              ((string *)&i,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"(DstStages & m_Barrier.SupportedStagesMask) != 0",(char (*) [49])this
              );
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar2,"TransitionImageLayout",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanCommandBuffer.cpp"
               ,0xa3);
    std::__cxx11::string::~string((string *)&i);
  }
  if (OldLayout == NewLayout) {
    (this->m_Barrier).MemorySrcStages = msg.field_2._12_4_ | (this->m_Barrier).MemorySrcStages;
    (this->m_Barrier).MemoryDstStages = DstStages | (this->m_Barrier).MemoryDstStages;
    VVar1 = anon_unknown_1::AccessMaskFromImageLayout(OldLayout,false);
    (this->m_Barrier).MemorySrcAccess = VVar1 | (this->m_Barrier).MemorySrcAccess;
    VVar1 = anon_unknown_1::AccessMaskFromImageLayout(NewLayout,true);
    (this->m_Barrier).MemoryDstAccess = VVar1 | (this->m_Barrier).MemoryDstAccess;
  }
  else {
    for (ImgBarrier_1 = (value_type *)0x0;
        pvVar3 = (value_type *)
                 std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::size
                           (&this->m_ImageBarriers), ImgBarrier_1 < pvVar3;
        ImgBarrier_1 = (value_type *)((long)&ImgBarrier_1->sType + 1)) {
      pvVar4 = std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::operator[]
                         (&this->m_ImageBarriers,(size_type)ImgBarrier_1);
      if (pvVar4->image == Image) {
        if (SubresRange->layerCount == 0xffffffff) {
          local_12c = 0xffffffff;
        }
        else {
          local_12c = SubresRange->baseArrayLayer + SubresRange->layerCount;
        }
        if ((pvVar4->subresourceRange).layerCount == 0xffffffff) {
          local_130 = 0xffffffff;
        }
        else {
          local_130 = (pvVar4->subresourceRange).baseArrayLayer +
                      (pvVar4->subresourceRange).layerCount;
        }
        Min0 = SubresRange->baseMipLevel;
        if (SubresRange->levelCount == 0xffffffff) {
          local_134 = 0xffffffff;
        }
        else {
          local_134 = SubresRange->baseMipLevel + SubresRange->levelCount;
        }
        Min1 = (pvVar4->subresourceRange).baseMipLevel;
        if ((pvVar4->subresourceRange).levelCount == 0xffffffff) {
          local_138 = 0xffffffff;
        }
        else {
          local_138 = (pvVar4->subresourceRange).baseMipLevel +
                      (pvVar4->subresourceRange).levelCount;
        }
        ImgBarrier._71_1_ =
             Diligent::CheckLineSectionOverlap<true,unsigned_int>
                       (SubresRange->baseArrayLayer,local_12c,
                        (pvVar4->subresourceRange).baseArrayLayer,local_130);
        ImgBarrier._70_1_ =
             Diligent::CheckLineSectionOverlap<true,unsigned_int>(Min0,local_134,Min1,local_138);
        if (((ImgBarrier._71_1_ & 1) != 0) && ((bool)ImgBarrier._70_1_)) {
          FlushBarriers(this);
          break;
        }
      }
    }
    (this->m_Barrier).ImageSrcStages = msg.field_2._12_4_ | (this->m_Barrier).ImageSrcStages;
    (this->m_Barrier).ImageDstStages = DstStages | (this->m_Barrier).ImageDstStages;
    memset(local_108,0,0x48);
    local_108._0_4_ = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
    ImgBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    ImgBarrier._4_4_ = 0;
    ImgBarrier.image = *(VkImage *)SubresRange;
    ImgBarrier.subresourceRange.aspectMask = SubresRange->levelCount;
    ImgBarrier.subresourceRange.baseMipLevel = SubresRange->baseArrayLayer;
    ImgBarrier.subresourceRange.levelCount = SubresRange->layerCount;
    ImgBarrier.srcAccessMask = OldLayout;
    ImgBarrier.dstAccessMask = NewLayout;
    ImgBarrier._32_8_ = Image;
    VVar1 = anon_unknown_1::AccessMaskFromImageLayout(OldLayout,false);
    ImgBarrier.pNext._0_4_ = VVar1 & (this->m_Barrier).SupportedAccessMask;
    VVar1 = anon_unknown_1::AccessMaskFromImageLayout(NewLayout,true);
    ImgBarrier.pNext._4_4_ = VVar1 & (this->m_Barrier).SupportedAccessMask;
    ImgBarrier.oldLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
    ImgBarrier.newLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
    std::vector<VkImageMemoryBarrier,std::allocator<VkImageMemoryBarrier>>::
    emplace_back<VkImageMemoryBarrier&>
              ((vector<VkImageMemoryBarrier,std::allocator<VkImageMemoryBarrier>> *)
               &this->m_ImageBarriers,(VkImageMemoryBarrier *)local_108);
  }
  return;
}

Assistant:

void VulkanCommandBuffer::TransitionImageLayout(VkImage                        Image,
                                                VkImageLayout                  OldLayout,
                                                VkImageLayout                  NewLayout,
                                                const VkImageSubresourceRange& SubresRange,
                                                VkPipelineStageFlags           SrcStages,
                                                VkPipelineStageFlags           DstStages)
{
    // Image layout transitions within a render pass execute
    // dependencies between attachments
    EndRenderScope();

    VERIFY_EXPR((SrcStages & m_Barrier.SupportedStagesMask) != 0);
    VERIFY_EXPR((DstStages & m_Barrier.SupportedStagesMask) != 0);

    if (OldLayout == NewLayout)
    {
        m_Barrier.MemorySrcStages |= SrcStages;
        m_Barrier.MemoryDstStages |= DstStages;

        m_Barrier.MemorySrcAccess |= AccessMaskFromImageLayout(OldLayout, false);
        m_Barrier.MemoryDstAccess |= AccessMaskFromImageLayout(NewLayout, true);
        return;
    }

    // Check overlapping subresources
    for (size_t i = 0; i < m_ImageBarriers.size(); ++i)
    {
        const auto& ImgBarrier = m_ImageBarriers[i];
        if (ImgBarrier.image != Image)
            continue;

        const auto& OtherRange = ImgBarrier.subresourceRange;

        const auto StartLayer0 = SubresRange.baseArrayLayer;
        const auto EndLayer0   = SubresRange.layerCount != VK_REMAINING_ARRAY_LAYERS ? (SubresRange.baseArrayLayer + SubresRange.layerCount) : ~0u;
        const auto StartLayer1 = OtherRange.baseArrayLayer;
        const auto EndLayer1   = OtherRange.layerCount != VK_REMAINING_ARRAY_LAYERS ? (OtherRange.baseArrayLayer + OtherRange.layerCount) : ~0u;

        const auto StartMip0 = SubresRange.baseMipLevel;
        const auto EndMip0   = SubresRange.levelCount != VK_REMAINING_MIP_LEVELS ? (SubresRange.baseMipLevel + SubresRange.levelCount) : ~0u;
        const auto StartMip1 = OtherRange.baseMipLevel;
        const auto EndMip1   = OtherRange.levelCount != VK_REMAINING_MIP_LEVELS ? (OtherRange.baseMipLevel + OtherRange.levelCount) : ~0u;

        const auto SlicesOverlap = Diligent::CheckLineSectionOverlap<true>(StartLayer0, EndLayer0, StartLayer1, EndLayer1);
        const auto MipsOverlap   = Diligent::CheckLineSectionOverlap<true>(StartMip0, EndMip0, StartMip1, EndMip1);

        // If the range overlaps with any of the existing barriers, we need to
        // flush them.
        if (SlicesOverlap && MipsOverlap)
        {
            FlushBarriers();
            break;
        }
    }

    m_Barrier.ImageSrcStages |= SrcStages;
    m_Barrier.ImageDstStages |= DstStages;

    VkImageMemoryBarrier ImgBarrier{};
    ImgBarrier.sType               = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
    ImgBarrier.pNext               = nullptr;
    ImgBarrier.oldLayout           = OldLayout;
    ImgBarrier.newLayout           = NewLayout;
    ImgBarrier.image               = Image;
    ImgBarrier.subresourceRange    = SubresRange;
    ImgBarrier.srcAccessMask       = AccessMaskFromImageLayout(OldLayout, false) & m_Barrier.SupportedAccessMask;
    ImgBarrier.dstAccessMask       = AccessMaskFromImageLayout(NewLayout, true) & m_Barrier.SupportedAccessMask;
    ImgBarrier.srcQueueFamilyIndex = VK_QUEUE_FAMILY_IGNORED; // source queue family for a queue family ownership transfer.
    ImgBarrier.dstQueueFamilyIndex = VK_QUEUE_FAMILY_IGNORED; // destination queue family for a queue family ownership transfer.
    m_ImageBarriers.emplace_back(ImgBarrier);
}